

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O2

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteRawMaybeAliased
          (EpsCopyOutputStream *this,void *data,int size,uint8_t *ptr)

{
  uint8_t *puVar1;
  
  if (this->aliasing_enabled_ == true) {
    puVar1 = WriteAliasedRaw(this,data,size,ptr);
    return puVar1;
  }
  if ((long)size <= (long)this->end_ - (long)ptr) {
    memcpy(ptr,data,(ulong)(uint)size);
    return ptr + size;
  }
  puVar1 = WriteRawFallback(this,data,size,ptr);
  return puVar1;
}

Assistant:

uint8_t* WriteRawMaybeAliased(const void* data, int size, uint8_t* ptr) {
    if (aliasing_enabled_) {
      return WriteAliasedRaw(data, size, ptr);
    } else {
      return WriteRaw(data, size, ptr);
    }
  }